

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5MultiIterNext(Fts5Index *p,Fts5Iter *pIter,int bFrom,i64 iFrom)

{
  ushort uVar1;
  Fts5DlidxIter *pIter_00;
  ushort *puVar2;
  byte bVar3;
  int iVar4;
  ushort uVar5;
  Fts5SegIter *pFVar6;
  int iVar7;
  bool bVar8;
  int bNewTerm;
  i64 local_48;
  uint local_3c;
  Fts5SegIter *local_38;
  
  bVar8 = bFrom == 0;
  local_48 = iFrom;
  do {
    if (p->rc != 0) {
      return;
    }
    uVar1 = pIter->aFirst[1].iFirst;
    bNewTerm = 0;
    pFVar6 = pIter->aSeg + uVar1;
    local_38 = pFVar6;
    if ((bVar8) || (pIter_00 = pFVar6->pDlidx, pIter_00 == (Fts5DlidxIter *)0x0)) {
      (*pFVar6->xNext)(p,pFVar6,&bNewTerm);
      bVar8 = pFVar6->pLeaf == (Fts5Data *)0x0;
LAB_001a390d:
      if (((bVar8) || (bNewTerm != 0)) ||
         (iVar4 = fts5MultiIterAdvanceRowid(pIter,(uint)uVar1,&local_38), pFVar6 = local_38,
         iVar4 != 0)) goto LAB_001a392c;
    }
    else {
      local_3c = pFVar6->flags;
      if ((local_3c & 2) == 0) {
        iVar7 = pFVar6->iLeafPgno;
        iVar4 = 0;
        while (((iVar4 == 0 && (pIter_00->aLvl[0].bEof == 0)) &&
               (pIter_00->aLvl[0].iRowid < local_48))) {
          iVar7 = pIter_00->aLvl[0].iLeafPgno;
          fts5DlidxIterNext(p,pIter_00);
          iVar4 = p->rc;
        }
        if (iVar7 <= pFVar6->iLeafPgno) goto LAB_001a385a;
        if (pFVar6->pSeg->pgnoLast < iVar7) {
LAB_001a382b:
          p->rc = 0x10b;
        }
        else {
          sqlite3_free(pFVar6->pNextLeaf);
          pFVar6->pNextLeaf = (Fts5Data *)0x0;
          pFVar6->iLeafPgno = iVar7 + -1;
          fts5SegIterNextPage(p,pFVar6);
          if (p->rc == 0) {
            puVar2 = (ushort *)pFVar6->pLeaf->p;
            uVar5 = *puVar2;
            uVar5 = uVar5 << 8 | uVar5 >> 8;
            if ((uVar5 < 4) || (pFVar6->pLeaf->szLeaf <= (int)(uint)uVar5)) goto LAB_001a382b;
            bVar3 = sqlite3Fts5GetVarint
                              ((uchar *)((long)puVar2 + (ulong)uVar5),(u64 *)&pFVar6->iRowid);
            pFVar6->iLeafOffset = (uint)bVar3 + (uint)uVar5;
            fts5SegIterLoadNPos(p,pFVar6);
          }
        }
      }
      else {
        iVar4 = 0;
        while (((iVar4 == 0 && (pIter_00->aLvl[0].bEof == 0)) &&
               (local_48 < pIter_00->aLvl[0].iRowid))) {
          fts5DlidxIterPrevR(p,pIter_00,0);
          iVar4 = p->rc;
        }
        iVar7 = pIter_00->aLvl[0].iLeafPgno;
        if (iVar7 < pFVar6->iLeafPgno) {
          pFVar6->iLeafPgno = iVar7 + 1;
          fts5SegIterReverseNewPage(p,pFVar6);
          goto LAB_001a38e0;
        }
LAB_001a385a:
        if (iVar4 == 0) goto LAB_001a3976;
      }
LAB_001a38e0:
      while (pFVar6->pLeaf != (Fts5Data *)0x0) {
        if ((local_3c & 2) != 0) {
          if (local_48 < pFVar6->iRowid) goto LAB_001a3904;
LAB_001a390b:
          bVar8 = false;
          goto LAB_001a390d;
        }
        if (local_48 <= pFVar6->iRowid) goto LAB_001a390b;
LAB_001a3904:
        if (p->rc != 0) goto LAB_001a390b;
LAB_001a3976:
        (*pFVar6->xNext)(p,pFVar6,(int *)0x0);
      }
LAB_001a392c:
      fts5MultiIterAdvanced(p,pIter,(uint)uVar1,1);
      fts5MultiIterSetEof(pIter);
      uVar1 = pIter->aFirst[1].iFirst;
      if (pIter->aSeg[uVar1].pLeaf == (Fts5Data *)0x0) {
        return;
      }
      pFVar6 = pIter->aSeg + uVar1;
    }
    if ((pIter->bSkipEmpty == '\0') || (pFVar6->nPos != 0)) {
      (*pIter->xSetOutputs)(pIter,pFVar6);
      return;
    }
    bVar8 = true;
  } while( true );
}

Assistant:

static void fts5MultiIterNext(
  Fts5Index *p, 
  Fts5Iter *pIter,
  int bFrom,                      /* True if argument iFrom is valid */
  i64 iFrom                       /* Advance at least as far as this */
){
  int bUseFrom = bFrom;
  assert( pIter->base.bEof==0 );
  while( p->rc==SQLITE_OK ){
    int iFirst = pIter->aFirst[1].iFirst;
    int bNewTerm = 0;
    Fts5SegIter *pSeg = &pIter->aSeg[iFirst];
    assert( p->rc==SQLITE_OK );
    if( bUseFrom && pSeg->pDlidx ){
      fts5SegIterNextFrom(p, pSeg, iFrom);
    }else{
      pSeg->xNext(p, pSeg, &bNewTerm);
    }

    if( pSeg->pLeaf==0 || bNewTerm 
     || fts5MultiIterAdvanceRowid(pIter, iFirst, &pSeg)
    ){
      fts5MultiIterAdvanced(p, pIter, iFirst, 1);
      fts5MultiIterSetEof(pIter);
      pSeg = &pIter->aSeg[pIter->aFirst[1].iFirst];
      if( pSeg->pLeaf==0 ) return;
    }

    fts5AssertMultiIterSetup(p, pIter);
    assert( pSeg==&pIter->aSeg[pIter->aFirst[1].iFirst] && pSeg->pLeaf );
    if( pIter->bSkipEmpty==0 || pSeg->nPos ){
      pIter->xSetOutputs(pIter, pSeg);
      return;
    }
    bUseFrom = 0;
  }
}